

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void cursespp::SchemaOverlay::ShowDoubleOverlay
               (DoubleEntry *entry,PrefsPtr *prefs,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *callback)

{
  double *__args_1;
  double dVar1;
  double maximum;
  Type TVar2;
  char cVar3;
  int iVar4;
  InputOverlay *pIVar5;
  __0 *this;
  OverlayStack *this_00;
  runtime_error *this_01;
  char *__s;
  DoubleEntry *doubleEntry;
  allocator<char> local_21a;
  allocator<char> local_219;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_218;
  shared_ptr<cursespp::InputOverlay> dialog;
  allocator<char> local_1f8 [32];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  formatter;
  string local_1a8;
  shared_ptr<cursespp::NumberValidator<double>_> validator;
  string local_178 [32];
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  __shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2> local_130 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<cursespp::InputOverlay::IValidator,(__gnu_cxx::_Lock_policy)2> local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> local_110;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  local_100;
  string local_e0;
  string title;
  string name;
  anon_class_80_3_1ce9ae6c handler;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,(entry->entry).name,(allocator<char> *)&handler);
  formatter.super__Function_base._M_functor._8_8_ = 0;
  formatter.super__Function_base._M_functor._4_4_ = 0;
  formatter.super__Function_base._M_functor._0_4_ = entry->precision;
  formatter._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:86:12)>
       ::_M_invoke;
  formatter.super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:86:12)>
       ::_M_manager;
  std::__cxx11::string::string((string *)&local_e0,(string *)&name);
  dVar1 = entry->minValue;
  maximum = entry->maxValue;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
  ::function(&local_100,&formatter);
  numberInputTitle<double>(&title,&local_e0,dVar1,maximum,&local_100);
  __args_1 = &entry->minValue;
  std::_Function_base::~_Function_base(&local_100.super__Function_base);
  std::__cxx11::string::~string((string *)&local_e0);
  std::
  make_shared<cursespp::NumberValidator<double>,double_const&,double_const&,std::function<std::__cxx11::string(double)>&>
            ((double *)&validator,__args_1,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double)>
              *)&entry->maxValue);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2> *)&handler,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&handler.name,(string *)&name);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&handler.callback,callback);
  pIVar5 = (InputOverlay *)operator_new(0x308);
  InputOverlay::InputOverlay(pIVar5);
  std::__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::InputOverlay,void>
            ((__shared_ptr<cursespp::InputOverlay,(__gnu_cxx::_Lock_policy)2> *)&dialog,pIVar5);
  pIVar5 = InputOverlay::SetTitle
                     (dialog.super___shared_ptr<cursespp::InputOverlay,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,&title);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_110,
             &prefs->super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_218,&local_110);
  TVar2 = (entry->entry).type;
  std::__cxx11::string::string<std::allocator<char>>(local_178,(entry->entry).name,&local_219);
  switch(TVar2) {
  case Bool:
    cVar3 = (**(code **)(*(long *)local_218._M_ptr + 0x50))
                      (local_218._M_ptr,local_178,*(undefined1 *)__args_1);
    __s = "false";
    if (cVar3 != '\0') {
      __s = "true";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,__s,local_1f8);
    break;
  case Int:
    iVar4 = (**(code **)(*(long *)local_218._M_ptr + 0x58))
                      (local_218._M_ptr,local_178,*(undefined4 *)&entry->maxValue);
    std::__cxx11::to_string(&local_1a8,iVar4);
    break;
  case Double:
    iVar4 = entry->precision;
    dVar1 = (double)(**(code **)(*(long *)local_218._M_ptr + 0x60))
                              (SUB84(entry->defaultValue,0),local_218._M_ptr,local_178);
    stringValueForDouble_abi_cxx11_(&local_1a8,dVar1,iVar4);
    break;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f8,(char *)*__args_1,&local_21a);
    (**(code **)(*(long *)local_218._M_ptr + 0x68))(&local_1a8,local_218._M_ptr,local_178,local_1f8)
    ;
    goto LAB_0018cf7d;
  case Enum:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f8,*(char **)&entry->precision,&local_21a);
    (**(code **)(*(long *)local_218._M_ptr + 0x68))(&local_1a8,local_218._M_ptr,local_178,local_1f8)
    ;
LAB_0018cf7d:
    std::__cxx11::string::~string((string *)local_1f8);
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"invalid type passed to stringValueFor!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
  pIVar5 = InputOverlay::SetText(pIVar5,&local_1a8);
  std::__shared_ptr<cursespp::InputOverlay::IValidator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::NumberValidator<double>,void>
            (local_120,
             &validator.
              super___shared_ptr<cursespp::NumberValidator<double>,_(__gnu_cxx::_Lock_policy)2>);
  pIVar5 = InputOverlay::SetValidator
                     (pIVar5,(shared_ptr<cursespp::InputOverlay::IValidator> *)local_120);
  iVar4 = overlayWidth();
  pIVar5 = InputOverlay::SetWidth(pIVar5,iVar4);
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  this = (__0 *)operator_new(0x50);
  ShowDoubleOverlay(f8n::sdk::ISchema::DoubleEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::__0(this,&handler);
  pcStack_140 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:335:20)>
                ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/SchemaOverlay.cpp:335:20)>
              ::_M_manager;
  local_158._M_unused._0_8_ = (undefined8)this;
  InputOverlay::SetInputAcceptedCallback(pIVar5,(InputAcceptedCallback *)&local_158);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  this_00 = App::Overlays();
  std::__shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::InputOverlay,void>
            (local_130,
             &dialog.super___shared_ptr<cursespp::InputOverlay,_(__gnu_cxx::_Lock_policy)2>);
  OverlayStack::Push(this_00,(ILayoutPtr *)local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dialog.super___shared_ptr<cursespp::InputOverlay,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ShowDoubleOverlay(f8n::sdk::ISchema::DoubleEntry_const*,std::shared_ptr<f8n::prefs::Preferences>,std::function<void(std::__cxx11::string)>)
  ::$_0::~__0((__0 *)&handler);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&validator.
              super___shared_ptr<cursespp::NumberValidator<double>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&title);
  std::_Function_base::~_Function_base(&formatter.super__Function_base);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void SchemaOverlay::ShowDoubleOverlay(
    const ISchema::DoubleEntry* entry,
    PrefsPtr prefs,
    std::function<void(std::string)> callback)
{
    std::string name(entry->entry.name);

    auto formatter = doubleFormatter(entry->precision);

    auto title = numberInputTitle(
        name, entry->minValue, entry->maxValue, formatter);

    auto validator = std::make_shared<NumberValidator<double>>(
        entry->minValue, entry->maxValue, formatter);

    auto handler = [prefs, name, callback](std::string value) {
        prefs->SetDouble(name, std::stod(value));
        if (callback) { callback(value); }
    };

    std::shared_ptr<InputOverlay> dialog(new InputOverlay());

    dialog->SetTitle(title)
        .SetText(stringValueFor(prefs, entry))
        .SetValidator(validator)
        .SetWidth(overlayWidth())
        .SetInputAcceptedCallback(handler);

    App::Overlays().Push(dialog);
}